

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st.c
# Opt level: O3

int str_hash(st_data_t astring)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  
  cVar1 = *(char *)astring;
  if (cVar1 == '\0') {
    iVar2 = 0;
  }
  else {
    pcVar3 = (char *)(astring + 1);
    iVar2 = 0;
    do {
      iVar2 = iVar2 * 0x3e5 + (int)cVar1;
      cVar1 = *pcVar3;
      pcVar3 = pcVar3 + 1;
    } while (cVar1 != '\0');
  }
  return (iVar2 >> 5) + iVar2;
}

Assistant:

static int
str_hash(st_data_t astring)
{
  const char* string = (const char* )astring;
  register int c;

#ifdef HASH_ELFHASH
  register unsigned int h = 0, g;

  while ((c = *string++) != '\0') {
    h = ( h << 4 ) + c;
    if ( g = h & 0xF0000000 )
	    h ^= g >> 24;
    h &= ~g;
  }
  return h;
#elif HASH_PERL
  register int val = 0;

  while ((c = *string++) != '\0') {
    val += c;
    val += (val << 10);
    val ^= (val >> 6);
  }
  val += (val << 3);
  val ^= (val >> 11);

  return val + (val << 15);
#else
  register int val = 0;

  while ((c = *string++) != '\0') {
    val = val*997 + c;
  }

  return val + (val>>5);
#endif
}